

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datefmt.cpp
# Opt level: O0

void __thiscall
icu_63::DateFormat::setContext(DateFormat *this,UDisplayContext value,UErrorCode *status)

{
  UBool UVar1;
  UErrorCode *status_local;
  UDisplayContext value_local;
  DateFormat *this_local;
  
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    if (value >> 8 == 1) {
      this->fCapitalizationContext = value;
    }
    else {
      *status = U_ILLEGAL_ARGUMENT_ERROR;
    }
  }
  return;
}

Assistant:

void DateFormat::setContext(UDisplayContext value, UErrorCode& status)
{
    if (U_FAILURE(status))
        return;
    if ( (UDisplayContextType)((uint32_t)value >> 8) == UDISPCTX_TYPE_CAPITALIZATION ) {
        fCapitalizationContext = value;
    } else {
        status = U_ILLEGAL_ARGUMENT_ERROR;
   }
}